

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CloseCurrentPopup(void)

{
  ImGuiPopupData *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  pIVar2 = GImGui;
  iVar4 = (GImGui->BeginPopupStack).Size;
  if ((0 < iVar4) && (iVar4 <= (GImGui->OpenPopupStack).Size)) {
    uVar3 = iVar4 - 1;
    uVar5 = (ulong)uVar3;
    pIVar1 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->BeginPopupStack).Data[uVar3].PopupId == pIVar1[uVar3].PopupId) {
      while (iVar4 = (int)uVar5, 0 < iVar4) {
        if ((pIVar1[uVar5].Window == (ImGuiWindow *)0x0) ||
           (((pIVar1[uVar5].Window)->Flags & 0x10000000) == 0)) goto LAB_00116fa0;
        uVar5 = (ulong)(iVar4 - 1);
        if ((pIVar1[uVar5].Window == (ImGuiWindow *)0x0) ||
           (((pIVar1[uVar5].Window)->Flags & 0x400) != 0)) goto LAB_00116fa0;
      }
      iVar4 = 0;
LAB_00116fa0:
      ClosePopupToLevel(iVar4,true);
      if (pIVar2->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar2->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window && !(parent_popup_window->Flags & ImGuiWindowFlags_MenuBar))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}